

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_utils.cpp
# Opt level: O1

void crnlib::utils::endian_switch_words(uint16 *p,uint num)

{
  ushort *puVar1;
  long lVar2;
  
  if (num != 0) {
    lVar2 = 0;
    do {
      puVar1 = (ushort *)((long)p + lVar2);
      *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
      lVar2 = lVar2 + 2;
    } while ((ulong)num * 2 != lVar2);
  }
  return;
}

Assistant:

void endian_switch_words(uint16* p, uint num)
        {
            uint16* p_end = p + num;
            while (p != p_end)
            {
                uint16 k = *p;
                *p++ = swap16(k);
            }
        }